

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O1

cmUVProcessChain __thiscall cmUVProcessChainBuilder::Start(cmUVProcessChainBuilder *this)

{
  pointer pPVar1;
  bool bVar2;
  pointer *__ptr;
  cmUVProcessChainBuilder *in_RSI;
  pointer config;
  
  cmUVProcessChain::cmUVProcessChain((cmUVProcessChain *)this);
  bVar2 = cmUVProcessChain::InternalData::Prepare((InternalData *)(this->Stdio)._M_elems[0],in_RSI);
  if (bVar2) {
    for (config = (in_RSI->Processes).
                  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar1 = (in_RSI->Processes).
                 super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                 ._M_impl.super__Vector_impl_data._M_finish, config != pPVar1; config = config + 1)
    {
      bVar2 = cmUVProcessChain::InternalData::AddCommand
                        ((InternalData *)(this->Stdio)._M_elems[0],config,
                         config == (in_RSI->Processes).
                                   super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                                   ._M_impl.super__Vector_impl_data._M_start,config == pPVar1 + -1);
      if (!bVar2) {
        return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                  )this;
      }
    }
    cmUVProcessChain::InternalData::Finish((InternalData *)(this->Stdio)._M_elems[0]);
  }
  return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
            )this;
}

Assistant:

cmUVProcessChain cmUVProcessChainBuilder::Start() const
{
  cmUVProcessChain chain;

  if (!chain.Data->Prepare(this)) {
    return chain;
  }

  for (auto it = this->Processes.begin(); it != this->Processes.end(); ++it) {
    if (!chain.Data->AddCommand(*it, it == this->Processes.begin(),
                                it == std::prev(this->Processes.end()))) {
      return chain;
    }
  }

  chain.Data->Finish();

  return chain;
}